

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O3

void get_FMlong8(FMFieldPtr field,void *data,unsigned_long *low_long,long *high_long)

{
  uchar uVar1;
  FMdata_type FVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  unsigned_long_long uVar9;
  longlong lVar10;
  unsigned_long uVar11;
  unsigned_long_long *data_00;
  FMFieldPtr field_00;
  longdouble in_ST0;
  FMgetFieldStruct tmp_field;
  undefined1 auStack_e0 [24];
  code *pcStack_c8;
  uchar uStack_bd;
  _FMgetFieldStruct _Stack_b0;
  unsigned_long *puStack_98;
  FMFieldPtr p_Stack_90;
  _FMgetFieldStruct local_48;
  
  *low_long = 0;
  if (high_long != (long *)0x0) {
    *high_long = 0;
  }
  if (field->data_type == float_type) {
    get_big_float((longdouble *)field,(FMFieldPtr)data,low_long);
    uVar11 = (unsigned_long)ROUND(in_ST0);
  }
  else {
    if (field->data_type != integer_type) {
      field_00 = field;
      get_FMlong8_cold_1();
      *data_00 = 0;
      if ((unsigned_long_long *)high_long != (unsigned_long_long *)0x0) {
        *high_long = 0;
      }
      FVar2 = field_00->data_type;
      if (FVar2 != integer_type) {
        puStack_98 = low_long;
        p_Stack_90 = field;
        if (FVar2 == float_type) {
          pcStack_c8 = (code *)0x122140;
          get_big_float((longdouble *)field_00,(FMFieldPtr)data,data_00);
          uVar9 = (unsigned_long_long)ROUND(in_ST0);
        }
        else {
          if (FVar2 != unsigned_type) {
            pcStack_c8 = get_FMchar;
            get_FMulong8_cold_1();
            if (field_00->data_type != char_type) {
              auStack_e0._16_8_ = get_FMenum;
              get_FMchar_cold_1();
              auStack_e0._0_8_ = field_00->offset;
              uVar8 = field_00->size;
              auStack_e0[0x10] = field_00->byte_swap;
              auStack_e0[0x11] = field_00->src_float_format;
              auStack_e0[0x12] = field_00->target_float_format;
              auStack_e0._19_5_ = *(undefined5 *)&field_00->field_0x13;
              auStack_e0._12_4_ = integer_type;
              auStack_e0._8_4_ = uVar8;
              get_big_int((FMFieldPtr)auStack_e0,data);
              return;
            }
            return;
          }
          if (field_00->size == 0x10) {
            sVar3 = field_00->offset;
            _Stack_b0.byte_swap = field_00->byte_swap;
            _Stack_b0.src_float_format = field_00->src_float_format;
            _Stack_b0.target_float_format = field_00->target_float_format;
            _Stack_b0._19_5_ = *(undefined5 *)&field_00->field_0x13;
            uVar6 = field_00->data_type;
            uStack_bd = field_00->byte_swap;
            _Stack_b0.offset = sVar3;
            if (uStack_bd == '\0') {
              _Stack_b0.offset = sVar3 + 8;
            }
            _Stack_b0.data_type = uVar6;
            _Stack_b0.size = 8;
            pcStack_c8 = (code *)0x1220f7;
            uVar9 = get_big_unsigned(&_Stack_b0,data);
            *data_00 = uVar9;
            if ((unsigned_long_long *)high_long == (unsigned_long_long *)0x0) {
              return;
            }
            _Stack_b0.offset = sVar3 + 8;
            if (uStack_bd == '\0') {
              _Stack_b0.offset = sVar3;
            }
            uVar7 = field_00->data_type;
            _Stack_b0.byte_swap = field_00->byte_swap;
            _Stack_b0.src_float_format = field_00->src_float_format;
            _Stack_b0.target_float_format = field_00->target_float_format;
            _Stack_b0._19_5_ = *(undefined5 *)&field_00->field_0x13;
            _Stack_b0.data_type = uVar7;
            _Stack_b0.size = 8;
            pcStack_c8 = (code *)0x122130;
            uVar9 = get_big_unsigned(&_Stack_b0,data);
            *high_long = uVar9;
            return;
          }
          pcStack_c8 = (code *)0x122171;
          uVar9 = get_big_unsigned(field_00,data);
        }
        *data_00 = uVar9;
      }
      return;
    }
    if (field->size == 0x10) {
      sVar3 = field->offset;
      local_48.byte_swap = field->byte_swap;
      local_48.src_float_format = field->src_float_format;
      local_48.target_float_format = field->target_float_format;
      local_48._19_5_ = *(undefined5 *)&field->field_0x13;
      uVar4 = field->data_type;
      uVar1 = field->byte_swap;
      local_48.offset = sVar3 + 8;
      if (uVar1 == '\0') {
        local_48.offset = sVar3;
      }
      local_48.data_type = uVar4;
      local_48.size = 8;
      uVar9 = get_big_unsigned(&local_48,data);
      *low_long = uVar9;
      if (high_long == (long *)0x0) {
        return;
      }
      local_48.offset = sVar3;
      if (uVar1 == '\0') {
        local_48.offset = sVar3 + 8;
      }
      uVar5 = field->data_type;
      local_48.byte_swap = field->byte_swap;
      local_48.src_float_format = field->src_float_format;
      local_48.target_float_format = field->target_float_format;
      local_48._19_5_ = *(undefined5 *)&field->field_0x13;
      local_48.data_type = uVar5;
      local_48.size = 8;
      lVar10 = get_big_int(&local_48,data);
      *high_long = lVar10;
      return;
    }
    uVar11 = get_big_int(field,data);
  }
  *low_long = uVar11;
  return;
}

Assistant:

extern void
get_FMlong8(FMFieldPtr field, void *data, unsigned long *low_long, long *high_long)
{
    *low_long = 0;
    if (high_long)
	*high_long = 0;
    if (field->data_type == integer_type) {
	if (field->size == 2 * sizeof(long)) {
	    size_t low_bytes_offset = field->offset;
	    size_t high_bytes_offset = field->offset;
	    FMgetFieldStruct tmp_field;  /*OK */
	    tmp_field = *field;
	    if (WORDS_BIGENDIAN) {
		if (field->byte_swap) {
		    high_bytes_offset += sizeof(long);
		} else {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		} else {
		    high_bytes_offset += sizeof(long);
		}
	    }
	    tmp_field.size = sizeof(long);
	    tmp_field.offset = low_bytes_offset;
	    *low_long = (unsigned long) get_FMulong(&tmp_field, data);
	    if (high_long) {
		tmp_field = *field;
		tmp_field.size = sizeof(long);
		tmp_field.offset = high_bytes_offset;
		*high_long = (long) get_FMlong(&tmp_field, data);
	    }
	} else {
	    *low_long = (long) get_FMlong(field, data);
	}
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp;
	tmp = get_big_float(field, data);
	*low_long = (long) tmp;
    } else {
	fprintf(stderr, "Get IOlong8 failed on invalid data type!\n");
	exit(1);
    }
}